

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListMatrixAddSingle(Fxu_Matrix *p,Fxu_Single *pLink)

{
  int *piVar1;
  Fxu_Single *pFVar2;
  
  if ((p->lSingles).pHead == (Fxu_Single *)0x0) {
    (p->lSingles).pHead = pLink;
    (p->lSingles).pTail = pLink;
    pLink->pPrev = (Fxu_Single *)0x0;
    pLink->pNext = (Fxu_Single *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Single *)0x0;
    pFVar2 = (p->lSingles).pTail;
    pFVar2->pNext = pLink;
    pLink->pPrev = pFVar2;
    (p->lSingles).pTail = pLink;
  }
  piVar1 = &(p->lSingles).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListMatrixAddSingle( Fxu_Matrix * p, Fxu_Single * pLink )
{
	Fxu_ListSingle * pList = &p->lSingles;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pPrev = NULL;
		pLink->pNext = NULL;
	}
	else
	{
		pLink->pNext = NULL;
		pList->pTail->pNext = pLink;
		pLink->pPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
}